

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

int AF_A_Look2(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  VM_UBYTE VVar2;
  uint uVar3;
  DObject *this;
  bool bVar4;
  int iVar5;
  uint uVar6;
  AActor *t2;
  AActor *t1;
  FState *pFVar7;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00497af4;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_00497ae4;
  t1 = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (t1 == (AActor *)0x0) goto LAB_00497923;
    bVar4 = DObject::IsKindOf((DObject *)t1,AActor::RegistrationInfo.MyClass);
    if (!bVar4) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00497af4;
    }
  }
  else {
    if (t1 != (AActor *)0x0) goto LAB_00497ae4;
LAB_00497923:
    t1 = (AActor *)0x0;
  }
  if (numparam != 1) {
    VVar2 = param[1].field_0.field_3.Type;
    if (VVar2 != 0xff) {
      if (VVar2 != '\x03') {
LAB_00497ae4:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_00497af4;
      }
      this = (DObject *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if ((this != (DObject *)0x0) &&
           (bVar4 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar4)) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00497af4;
        }
      }
      else if (this != (DObject *)0x0) goto LAB_00497ae4;
    }
    if (((2 < (uint)numparam) && (VVar2 = param[2].field_0.field_3.Type, VVar2 != 0xff)) &&
       ((VVar2 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_00497af4:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                    ,0x88c,"int AF_A_Look2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if (((t1->flags5).Value & 0x20000000) != 0) {
    return 0;
  }
  t1->threshold = 0;
  t2 = GC::ReadBarrier<AActor>((AActor **)&t1->LastHeard);
  if (((t2 != (AActor *)0x0) && (0 < t2->health)) && (uVar6 = (t2->flags).Value, (uVar6 & 4) != 0))
  {
    uVar3 = (t1->flags).Value;
    if (((level.flags._3_1_ & 0x20) == 0) && (((uVar6 ^ uVar3) >> 0x1b & 1) == 0)) {
      bVar4 = P_LookForPlayers(t1,(t1->flags4).Value & 0x10000,(FLookExParams *)0x0);
      if (bVar4) {
        AActor::SetState(t1,t1->SeeState,false);
        pbVar1 = (byte *)((long)&(t1->flags4).Value + 1);
        *pbVar1 = *pbVar1 | 0x80;
        return 0;
      }
    }
    else if (((uVar3 & 0x20) == 0) || (bVar4 = P_CheckSight(t1,t2,4), bVar4)) {
      (t1->target).field_0.p = t2;
      t1->threshold = 10;
      pFVar7 = t1->SeeState;
      goto LAB_00497ad3;
    }
  }
  iVar5 = FRandom::operator()(&pr_look2);
  if (iVar5 < 0x1e) {
    pFVar7 = t1->SpawnState;
    uVar6 = FRandom::operator()(&pr_look2);
    AActor::SetState(t1,pFVar7 + (ulong)(uVar6 & 1) + 1,false);
  }
  if (((t1->flags4).Value & 0x20000) != 0) {
    return 0;
  }
  iVar5 = FRandom::operator()(&pr_look2);
  if (0x27 < iVar5) {
    return 0;
  }
  pFVar7 = t1->SpawnState + 3;
LAB_00497ad3:
  AActor::SetState(t1,pFVar7,false);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Look2)
{
	PARAM_ACTION_PROLOGUE;

	AActor *targ;

	if (self->flags5 & MF5_INCONVERSATION)
		return 0;

	self->threshold = 0;
	targ = self->LastHeard;

	if (targ != NULL && targ->health <= 0)
	{
		targ = NULL;
	}

	if (targ && (targ->flags & MF_SHOOTABLE))
	{
		if ((level.flags & LEVEL_NOALLIES) ||
			(self->flags & MF_FRIENDLY) != (targ->flags & MF_FRIENDLY))
		{
			if (self->flags & MF_AMBUSH)
			{
				if (!P_CheckSight (self, targ, SF_SEEPASTBLOCKEVERYTHING))
					goto nosee;
			}
			self->target = targ;
			self->threshold = 10;
			self->SetState (self->SeeState);
			return 0;
		}
		else
		{
			if (!P_LookForPlayers (self, self->flags4 & MF4_LOOKALLAROUND, NULL))
				goto nosee;
			self->SetState (self->SeeState);
			self->flags4 |= MF4_INCOMBAT;
			return 0;
		}
	}
nosee:
	if (pr_look2() < 30)
	{
		self->SetState (self->SpawnState + (pr_look2() & 1) + 1);
	}
	if (!(self->flags4 & MF4_STANDSTILL) && pr_look2() < 40)
	{
		self->SetState (self->SpawnState + 3);
	}
	return 0;
}